

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_direct.c
# Opt level: O2

void SUNDlsMat_SetToZero(SUNDlsMat A)

{
  int iVar1;
  int iVar2;
  int iVar3;
  realtype *prVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  
  if (A->type == 2) {
    iVar1 = A->mu;
    iVar2 = A->ml;
    uVar6 = 0;
    uVar5 = (ulong)(uint)A->M;
    if (A->M < 1) {
      uVar5 = uVar6;
    }
    for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
      iVar3 = A->s_mu;
      prVar4 = A->cols[uVar6];
      for (lVar9 = 0; lVar9 <= (long)iVar2 + (long)iVar1; lVar9 = lVar9 + 1) {
        prVar4[(long)iVar3 + (lVar9 - iVar1)] = 0.0;
      }
    }
  }
  else if (A->type == 1) {
    uVar5 = (ulong)(uint)A->N;
    if (A->N < 1) {
      uVar5 = 0;
    }
    for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
      prVar4 = A->cols[uVar6];
      uVar7 = (ulong)(uint)A->M;
      if (A->M < 1) {
        uVar7 = 0;
      }
      for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        prVar4[uVar8] = 0.0;
      }
    }
  }
  return;
}

Assistant:

void SUNDlsMat_SetToZero(SUNDlsMat A)
{
  sunindextype i, j, colSize;
  realtype *col_j;

  switch (A->type) {

  case SUNDIALS_DENSE:

    for (j=0; j<A->N; j++) {
      col_j = A->cols[j];
      for (i=0; i<A->M; i++)
        col_j[i] = ZERO;
    }

    break;

  case SUNDIALS_BAND:

    colSize = A->mu + A->ml + 1;
    for (j=0; j<A->M; j++) {
      col_j = A->cols[j] + A->s_mu - A->mu;
      for (i=0; i<colSize; i++)
        col_j[i] = ZERO;
    }

    break;

  }

}